

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_function.hpp
# Opt level: O3

Proxy_Function
chaiscript::dispatch::detail::
make_callable_impl<std::function<int(int)>TestBaseType::*,true,true,true,false,std::function<int(int)>,TestBaseType&>
          (element_type *func,offset_in_TestBaseType_to_function<int_(int)> *param_2)

{
  Attribute_Access<std::function<int_(int)>,_TestBaseType> *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Proxy_Function PVar1;
  
  this = (Attribute_Access<std::function<int_(int)>,_TestBaseType> *)operator_new(0x48);
  Attribute_Access<std::function<int_(int)>,_TestBaseType>::Attribute_Access(this,*param_2);
  func->_vptr_Proxy_Function_Base = (_func_int **)this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::dispatch::Proxy_Function_Base*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&func->m_types,
             (Proxy_Function_Base *)this);
  PVar1.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = func;
  return (Proxy_Function)
         PVar1.
         super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto make_callable_impl(Func &&func, Function_Signature<Ret, Function_Params<Param...>, Is_Noexcept, Is_Member, Is_MemberObject, Is_Object>) {
      if constexpr (Is_MemberObject) {
        // we now that the Param pack will have only one element, so we are safe expanding it here
        return Proxy_Function(chaiscript::make_shared<dispatch::Proxy_Function_Base, dispatch::Attribute_Access<Ret, std::decay_t<Param>...>>(
            std::forward<Func>(func)));
      } else if constexpr (Is_Member) {
        // TODO some kind of bug is preventing forwarding of this noexcept for the lambda
        auto call = [func = std::forward<Func>(func)](auto &&obj, auto &&...param) /* noexcept(Is_Noexcept) */ -> decltype(auto) {
          return ((get_first_param(Function_Params<Param...>{}, obj).*func)(std::forward<decltype(param)>(param)...));
        };
        return Proxy_Function(
            chaiscript::make_shared<dispatch::Proxy_Function_Base, dispatch::Proxy_Function_Callable_Impl<Ret(Param...), decltype(call)>>(
                std::move(call)));
      } else {
        return Proxy_Function(
            chaiscript::make_shared<dispatch::Proxy_Function_Base, dispatch::Proxy_Function_Callable_Impl<Ret(Param...), std::decay_t<Func>>>(
                std::forward<Func>(func)));
      }
    }